

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O1

wchar_t project_player_handler_WATER(project_player_handler_context_t *context)

{
  player *ppVar1;
  uint32_t uVar2;
  
  ppVar1 = player;
  uVar2 = Rand_div(5);
  player_inc_timed(ppVar1,L'\x04',uVar2 + L'\x06',true,true,true);
  ppVar1 = player;
  uVar2 = Rand_div(0x28);
  player_inc_timed(ppVar1,L'\t',uVar2 + L'\x01',true,true,true);
  return L'\0';
}

Assistant:

static int project_player_handler_WATER(project_player_handler_context_t *context)
{
	/* Confusion */
	(void)player_inc_timed(player, TMD_CONFUSED, 5 + randint1(5), true,
		true, true);

	/* Stun */
	(void)player_inc_timed(player, TMD_STUN, randint1(40), true, true,
		true);
	return 0;
}